

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  undefined8 in_RAX;
  long *plVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  undefined8 local_38;
  int n;
  int v;
  
  local_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_38);
  std::istream::ignore();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"n == ",5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(int)local_38);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if ((int)local_38 < 1) {
    uVar5 = 0x18894;
    bVar8 = true;
  }
  else {
    iVar7 = -1;
    uVar5 = 0x18894;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + 1;
      std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_38 + 4));
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38._4_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar1 = -local_38._4_4_;
      if (0 < (int)local_38._4_4_) {
        uVar1 = local_38._4_4_;
      }
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      if ((uVar1 < uVar4) || (((0 < (int)local_38._4_4_ && ((int)uVar5 < 0)) && (uVar4 == uVar1))))
      {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"yes",3);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        uVar5 = local_38._4_4_;
        iVar7 = iVar6;
      }
    } while (iVar6 < (int)local_38);
    bVar8 = iVar7 == -1;
  }
  if (bVar8) {
    plVar2 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0",1);
  }
  else {
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	int n;
    std::cin >> n;
    std::cin.ignore();
	std::cerr << "n == " << n << std::endl;
	
	int v;
	int min = -1;
	int mvalue = 100500;
	for (int i = 1; i <= n; i++)
	{
        std::cin >> v;
		std::cerr << i << ": " << v << " " << std::endl;
		if (abs(v) < abs(mvalue)
		    || (abs(mvalue) == abs(v) && mvalue < 0 && v > 0))
	    {
	        std::cerr << "yes" << std::endl;
	        min = i;
	        mvalue = v;
	    }
	}
	
	if (-1 == min)
	{
	    std::cout << "0" << std::endl;
	} else
	{
	    std::cout << mvalue << std::endl;
	}

	return 0;
}